

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O3

double normalcdf(double x,double mu,double sigma)

{
  double dVar1;
  
  if (0.0 <= sigma) {
    dVar1 = erf((x - mu) / (sigma * 1.4142135623730951));
    return (dVar1 + 1.0) * 0.5;
  }
  printf("Standard Deviation (Sigma) must be non-negative");
  exit(1);
}

Assistant:

double normalcdf(double x, double mu, double sigma) {
	double oup,t;
	
	if (sigma < 0.) {
		printf("Standard Deviation (Sigma) must be non-negative");
		exit(1);
	}
	
	t = (x - mu ) /(sqrt(2.0) * sigma);
	
	oup = 0.5 * (1. + erf(t));
	return oup;
}